

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall
bloom_tests::merkle_block_2_with_update_none::test_method(merkle_block_2_with_update_none *this)

{
  long lVar1;
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  bool bVar2;
  reference __src;
  size_type sVar3;
  const_string *file;
  const_string *pcVar4;
  long in_FS_OFFSET;
  CMerkleBlock *in_stack_ffffffffffffebf8;
  undefined7 in_stack_ffffffffffffec00;
  undefined1 in_stack_ffffffffffffec07;
  undefined7 in_stack_ffffffffffffec08;
  undefined1 in_stack_ffffffffffffec0f;
  DataStream *in_stack_ffffffffffffec10;
  CBlock *in_stack_ffffffffffffec18;
  undefined7 in_stack_ffffffffffffec20;
  undefined1 in_stack_ffffffffffffec27;
  size_t in_stack_ffffffffffffec28;
  size_t line_num;
  const_string *in_stack_ffffffffffffec30;
  undefined7 in_stack_ffffffffffffec38;
  undefined1 in_stack_ffffffffffffec3f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffec40;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffec48;
  CPartialMerkleTree *in_stack_ffffffffffffec50;
  undefined7 in_stack_ffffffffffffec58;
  undefined1 in_stack_ffffffffffffec5f;
  uint i_1;
  uint i;
  merkle_block_2_with_update_none *this_local;
  const_string local_11b0 [2];
  lazy_ostream local_1190 [2];
  assertion_result local_1170 [2];
  const_string local_1138 [2];
  lazy_ostream local_1118 [2];
  assertion_result local_10f8 [2];
  const_string local_10c0 [2];
  lazy_ostream local_10a0 [2];
  assertion_result local_1080 [2];
  const_string local_1048 [2];
  lazy_ostream local_1028 [2];
  assertion_result local_1008 [2];
  const_string local_fd0 [2];
  lazy_ostream local_fb0 [2];
  assertion_result local_f90 [2];
  const_string local_f58 [2];
  lazy_ostream local_f38 [2];
  assertion_result local_f18 [2];
  const_string local_ee0 [2];
  lazy_ostream local_ec0 [2];
  assertion_result local_ea0 [2];
  const_string local_e68 [2];
  lazy_ostream local_e48 [2];
  assertion_result local_e28 [2];
  const_string local_df0 [2];
  lazy_ostream local_dd0 [2];
  assertion_result local_db0 [2];
  const_string local_d78 [2];
  lazy_ostream local_d58 [2];
  assertion_result local_d38 [3];
  const_string local_cf0 [2];
  lazy_ostream local_cd0 [2];
  assertion_result local_cb0 [2];
  const_string local_c78 [2];
  lazy_ostream local_c58 [2];
  assertion_result local_c38 [2];
  const_string local_c00 [2];
  lazy_ostream local_be0 [2];
  assertion_result local_bc0 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  const_string local_b58 [2];
  lazy_ostream local_b38 [2];
  assertion_result local_b18 [2];
  const_string local_ae0 [2];
  lazy_ostream local_ac0 [2];
  assertion_result local_aa0 [2];
  const_string local_a68 [2];
  lazy_ostream local_a48 [2];
  assertion_result local_a28 [2];
  const_string local_9f0 [2];
  lazy_ostream local_9d0 [2];
  assertion_result local_9b0 [3];
  ParamsWrapper<TransactionSerParams,_CBlock> local_968;
  DataStream stream;
  CBloomFilter filter;
  pair<unsigned_int,_uint256> pair;
  CMerkleBlock merkleBlock;
  CBlock block;
  
  local_1008[0].m_message.px = (element_type *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(in_stack_ffffffffffffec18);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<2771UL>___1,_0,_0,_0,_117,_97,_98,_54,_204,_33,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,1385ul>>
            ((Span<const_std::byte> *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
             (array<std::byte,_1385UL> *)
             CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),in_stack_ffffffffffffebf8
            );
  sp.m_data._7_1_ = in_stack_ffffffffffffec27;
  sp.m_data._0_7_ = in_stack_ffffffffffffec20;
  sp.m_size = in_stack_ffffffffffffec28;
  DataStream::DataStream(in_stack_ffffffffffffec10,sp);
  local_968 = TransactionSerParams::operator()
                        ((TransactionSerParams *)
                         CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                         (CBlock *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
  DataStream::operator>>
            ((DataStream *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
             (ParamsWrapper<TransactionSerParams,_CBlock> *)
             CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
  CBloomFilter::CBloomFilter
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58),
             (uint)((ulong)in_stack_ffffffffffffec50 >> 0x20),(double)in_stack_ffffffffffffec48,
             (uint)((ulong)in_stack_ffffffffffffec40 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffec40 >> 0x18));
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
             (uint256 *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
             in_stack_ffffffffffffebf8);
  vKey.m_data._7_1_ = in_stack_ffffffffffffec27;
  vKey.m_data._0_7_ = in_stack_ffffffffffffec20;
  vKey.m_size = in_stack_ffffffffffffec28;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),vKey);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
             (CBlock *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
             (CBloomFilter *)in_stack_ffffffffffffebf8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    CBlockHeader::GetHash(&in_stack_ffffffffffffec18->super_CBlockHeader);
    CBlockHeader::GetHash(&in_stack_ffffffffffffec18->super_CBlockHeader);
    ::operator==((base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9b0,local_9d0,local_9f0,0x11e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a28,local_a48,local_a68,0x120,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  __src = std::
          vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          ::operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                        *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                       CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
  memcpy(&pair,__src,0x24);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    ::operator==((base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_aa0,local_ac0,local_ae0,0x123,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b18,local_b38,local_b58,0x124,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffebf8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffebf8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    CPartialMerkleTree::ExtractMatches
              (in_stack_ffffffffffffec50,in_stack_ffffffffffffec48,in_stack_ffffffffffffec40);
    ::operator==((base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_bc0,local_be0,local_c00,0x128,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::vector<uint256,_std::allocator<uint256>_>::size
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffebf8);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c38,local_c58,local_c78,0x129,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  i = 0;
  while( true ) {
    sVar3 = std::vector<uint256,_std::allocator<uint256>_>::size
                      ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffebf8);
    if (sVar3 <= i) break;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
                 (unsigned_long)in_stack_ffffffffffffebf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
                 in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
                 (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
      std::vector<uint256,_std::allocator<uint256>_>::operator[]
                ((vector<uint256,_std::allocator<uint256>_> *)
                 CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
      std::
      vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
      operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
      ::operator==((base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                   (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00))
      ;
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (bool)in_stack_ffffffffffffec07);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
                 (unsigned_long)in_stack_ffffffffffffebf8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
                 (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
                 (unsigned_long)in_stack_ffffffffffffebf8);
      in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_cb0,local_cd0,local_cf0,299,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffebf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffebf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    i = i + 1;
  }
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<131UL>___4,_74,_101,_111,_6,_88,_113,_163,_83,_242,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,65ul>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
             (array<unsigned_char,_65UL> *)
             CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),in_stack_ffffffffffffebf8
            );
  vKey_00.m_data._7_1_ = in_stack_ffffffffffffec27;
  vKey_00.m_data._0_7_ = in_stack_ffffffffffffec20;
  vKey_00.m_size = in_stack_ffffffffffffec28;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),vKey_00);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
             (CBlock *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
             (CBloomFilter *)in_stack_ffffffffffffebf8);
  CMerkleBlock::operator=
            ((CMerkleBlock *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
             (CMerkleBlock *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
  CMerkleBlock::~CMerkleBlock(in_stack_ffffffffffffebf8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    CBlockHeader::GetHash(&in_stack_ffffffffffffec18->super_CBlockHeader);
    CBlockHeader::GetHash(&in_stack_ffffffffffffec18->super_CBlockHeader);
    ::operator==((base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d38,local_d58,local_d78,0x133,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_db0,local_dd0,local_df0,0x135,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    std::operator==((pair<unsigned_int,_uint256> *)
                    CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                    (pair<unsigned_int,_uint256> *)
                    CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e28,local_e48,local_e68,0x137,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    ::operator==((base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ea0,local_ec0,local_ee0,0x139,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f18,local_f38,local_f58,0x13a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    ::operator==((base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f90,local_fb0,local_fd0,0x13c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1008,local_1028,local_1048,0x13d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    CPartialMerkleTree::ExtractMatches
              (in_stack_ffffffffffffec50,in_stack_ffffffffffffec48,in_stack_ffffffffffffec40);
    ::operator==((base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (base_blob<256U> *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1080,local_10a0,local_10c0,0x13f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
               in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
               (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
    std::vector<uint256,_std::allocator<uint256>_>::size
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffebf8);
    std::
    vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
    size((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
          *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (bool)in_stack_ffffffffffffec07);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
               (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
               (unsigned_long)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10f8,local_1118,local_1138,0x140,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffebf8);
    in_stack_ffffffffffffec3f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffec3f);
  i_1 = 0;
  while( true ) {
    file = (const_string *)(ulong)i_1;
    pcVar4 = (const_string *)
             std::vector<uint256,_std::allocator<uint256>_>::size
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffebf8);
    if (pcVar4 <= file) break;
    do {
      line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
                 (unsigned_long)in_stack_ffffffffffffebf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffec3f,in_stack_ffffffffffffec38),
                 file,line_num,
                 (const_string *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20));
      std::vector<uint256,_std::allocator<uint256>_>::operator[]
                ((vector<uint256,_std::allocator<uint256>_> *)
                 CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
      std::
      vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>::
      operator[]((vector<std::pair<unsigned_int,_uint256>,_std::allocator<std::pair<unsigned_int,_uint256>_>_>
                  *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
      in_stack_ffffffffffffec27 =
           ::operator==((base_blob<256U> *)
                        CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                        (base_blob<256U> *)
                        CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (bool)in_stack_ffffffffffffec07);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
                 (unsigned_long)in_stack_ffffffffffffebf8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
                 (basic_cstring<const_char> *)in_stack_ffffffffffffebf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08),
                 (pointer)CONCAT17(in_stack_ffffffffffffec07,in_stack_ffffffffffffec00),
                 (unsigned_long)in_stack_ffffffffffffebf8);
      in_stack_ffffffffffffebf8 = (CMerkleBlock *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1170,local_1190,local_11b0,0x142,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffebf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffebf8);
      in_stack_ffffffffffffec0f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_ffffffffffffec0f);
    i_1 = i_1 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08));
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)
             CONCAT17(in_stack_ffffffffffffec0f,in_stack_ffffffffffffec08));
  CMerkleBlock::~CMerkleBlock(in_stack_ffffffffffffebf8);
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffebf8);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffebf8);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffebf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_2_with_update_none)
{
    // Random real block (000000005a4ded781e667e06ceefafb71410b511fe0d5adc3e5a27ecbec34ae6)
    // With 4 txes
    CBlock block;
    DataStream stream{
        "0100000075616236cc2126035fadb38deb65b9102cc2c41c09cdf29fc051906800000000fe7d5e12ef0ff901f6050211249919b1c0653771832b3a80c66cea42847f0ae1d4d26e49ffff001d00f0a4410401000000010000000000000000000000000000000000000000000000000000000000000000ffffffff0804ffff001d029105ffffffff0100f2052a010000004341046d8709a041d34357697dfcb30a9d05900a6294078012bf3bb09c6f9b525f1d16d5503d7905db1ada9501446ea00728668fc5719aa80be2fdfc8a858a4dbdd4fbac00000000010000000255605dc6f5c3dc148b6da58442b0b2cd422be385eab2ebea4119ee9c268d28350000000049483045022100aa46504baa86df8a33b1192b1b9367b4d729dc41e389f2c04f3e5c7f0559aae702205e82253a54bf5c4f65b7428551554b2045167d6d206dfe6a2e198127d3f7df1501ffffffff55605dc6f5c3dc148b6da58442b0b2cd422be385eab2ebea4119ee9c268d2835010000004847304402202329484c35fa9d6bb32a55a70c0982f606ce0e3634b69006138683bcd12cbb6602200c28feb1e2555c3210f1dddb299738b4ff8bbe9667b68cb8764b5ac17b7adf0001ffffffff0200e1f505000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00180d8f000000004341044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45afac0000000001000000025f9a06d3acdceb56be1bfeaa3e8a25e62d182fa24fefe899d1c17f1dad4c2028000000004847304402205d6058484157235b06028c30736c15613a28bdb768ee628094ca8b0030d4d6eb0220328789c9a2ec27ddaec0ad5ef58efded42e6ea17c2e1ce838f3d6913f5e95db601ffffffff5f9a06d3acdceb56be1bfeaa3e8a25e62d182fa24fefe899d1c17f1dad4c2028010000004a493046022100c45af050d3cea806cedd0ab22520c53ebe63b987b8954146cdca42487b84bdd6022100b9b027716a6b59e640da50a864d6dd8a0ef24c76ce62391fa3eabaf4d2886d2d01ffffffff0200e1f505000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00180d8f000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac000000000100000002e2274e5fea1bf29d963914bd301aa63b64daaf8a3e88f119b5046ca5738a0f6b0000000048473044022016e7a727a061ea2254a6c358376aaa617ac537eb836c77d646ebda4c748aac8b0220192ce28bf9f2c06a6467e6531e27648d2b3e2e2bae85159c9242939840295ba501ffffffffe2274e5fea1bf29d963914bd301aa63b64daaf8a3e88f119b5046ca5738a0f6b010000004a493046022100b7a1a755588d4190118936e15cd217d133b0e4a53c3c15924010d5648d8925c9022100aaef031874db2114f2d869ac2de4ae53908fbfea5b2b1862e181626bb9005c9f01ffffffff0200e1f505000000004341044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45afac00180d8f000000004341046a0765b5865641ce08dd39690aade26dfbf5511430ca428a3089261361cef170e3929a68aee3d8d4848b0c5111b0a37b82b86ad559fd2a745b44d8e8d9dfdc0cac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_NONE);
    // Match the first transaction
    filter.insert(uint256{"e980fe9f792d014e73b95203dc1335c5f9ce19ac537a419e6df5b47aecb93b70"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 1);
    std::pair<unsigned int, uint256> pair = merkleBlock.vMatchedTxn[0];

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"e980fe9f792d014e73b95203dc1335c5f9ce19ac537a419e6df5b47aecb93b70"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 0);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    // Match an output from the second transaction (the pubkey for address 1DZTzaBHUDM7T3QvUKBz4qXMRpkg8jsfB5)
    // This should not match the third transaction though it spends the output matched
    // It will match the fourth transaction, which has another pay-to-pubkey output to the same address
    filter.insert("044a656f065871a353f216ca26cef8dde2f03e8c16202d2e8ad769f02032cb86a5eb5e56842e92e19141d60a01928f8dd2c875a390f67c1f6c94cfc617c0ea45af"_hex_u8);

    merkleBlock = CMerkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 3);

    BOOST_CHECK(pair == merkleBlock.vMatchedTxn[0]);

    BOOST_CHECK(merkleBlock.vMatchedTxn[1].second == uint256{"28204cad1d7fc1d199e8ef4fa22f182de6258a3eaafe1bbe56ebdcacd3069a5f"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[1].first == 1);

    BOOST_CHECK(merkleBlock.vMatchedTxn[2].second == uint256{"3c1d7e82342158e4109df2e0b6348b6e84e403d8b4046d7007663ace63cddb23"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[2].first == 3);

    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);
}